

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O3

ExecutionResult * __thiscall
ASTNode::evaluate(ExecutionResult *__return_storage_ptr__,ASTNode *this,Context *context)

{
  uint uVar1;
  pointer pcVar2;
  shared_ptr<SchemeObject> *psVar3;
  unique_ptr<TailContext,_std::default_delete<TailContext>_> this_00;
  undefined8 uVar4;
  bool bVar5;
  uchar uVar6;
  int iVar7;
  long lVar8;
  uint *puVar9;
  longlong lVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  SchemeSpecialForm *this_01;
  int *piVar12;
  _List_node_base *p_Var13;
  runtime_error *prVar14;
  eval_error *this_02;
  undefined8 uVar15;
  shared_ptr<SchemeObject> *psVar16;
  _List_node_base *p_Var17;
  uint uVar18;
  ASTNode *pAVar19;
  list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *__x;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  double dVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> num;
  list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> val_list;
  shared_ptr<SchemeObject> func;
  shared_ptr<SchemeProcedure> f;
  undefined1 local_e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  ExecutionResult local_a8;
  double local_80;
  _List_node_base *local_78;
  _List_node_base *p_Stack_70;
  string local_68;
  _List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> local_48;
  
  pAVar19 = this;
  switch(this->type) {
  case NAME:
    local_c8._M_allocated_capacity = 0;
    local_c8._8_8_ = 0;
    bVar5 = Context::get(context,&this->value,(shared_ptr<SchemeObject> *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_allocated_capacity ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
      if (bVar5) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8
                       ,"Unassigned variable: ",&this->value);
        std::runtime_error::runtime_error(prVar14,(string *)local_e8);
        *(undefined ***)prVar14 = &PTR__runtime_error_0016b300;
        __cxa_throw(prVar14,&eval_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00124988;
    }
    __return_storage_ptr__->type = VALUE;
    (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)local_c8._M_allocated_capacity;
    (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._8_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_0012465f;
    local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_c8._8_8_;
    if (__libc_single_threaded != '\0') {
      *(_Atomic_word *)(local_c8._8_8_ + 8) = *(_Atomic_word *)(local_c8._8_8_ + 8) + 1;
      (__return_storage_ptr__->tail_context)._M_t.
      super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
      super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
      super__Head_base<0UL,_TailContext_*,_false>._M_head_impl = (TailContext *)0x0;
      goto LAB_00124854;
    }
    LOCK();
    *(_Atomic_word *)(local_c8._8_8_ + 8) = *(_Atomic_word *)(local_c8._8_8_ + 8) + 1;
    UNLOCK();
    (__return_storage_ptr__->tail_context)._M_t.
    super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
    super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
    super__Head_base<0UL,_TailContext_*,_false>._M_head_impl = (TailContext *)0x0;
    break;
  case INT:
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(this->value)._M_dataplus._M_p;
    piVar12 = __errno_location();
    iVar7 = *piVar12;
    *piVar12 = 0;
    lVar10 = strtoll(paVar20->_M_local_buf,(char **)local_e8,10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._0_8_ == paVar20) {
      std::__throw_invalid_argument("stoll");
LAB_001248e1:
      this_02 = (eval_error *)__cxa_allocate_exception(0x10);
      eval_error::runtime_error(this_02,"Trying to evaluate empty list");
LAB_001248fd:
      __cxa_throw(this_02,&eval_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (*piVar12 == 0) {
      *piVar12 = iVar7;
    }
    else if (*piVar12 == 0x22) {
      std::__throw_out_of_range("stoll");
      goto switchD_001240f9_caseD_6;
    }
    local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)operator_new(0x20);
    *(char *)((long)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 8) = '\x01';
    *(char *)((long)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 9) = '\0';
    *(char *)((long)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 10) = '\0';
    *(char *)((long)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 0xb) = '\0';
    *(char *)((long)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 0xc) = '\x01';
    *(char *)((long)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 0xd) = '\0';
    *(char *)((long)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 0xe) = '\0';
    *(char *)((long)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 0xf) = '\0';
    *local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type)&PTR___Sp_counted_ptr_inplace_0016b418;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)((long)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
        0x10))->_M_allocated_capacity = (size_type)&PTR__SchemeObject_0016b638;
    *(longlong *)
     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)((long)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          + 0x10))->_M_local_buf + 8) = lVar10;
    goto LAB_001246e7;
  case FLOAT:
    pAVar19 = (ASTNode *)&this->value;
    lVar8 = std::__cxx11::string::find((char)pAVar19,0x2f);
    if (lVar8 != -1) {
      std::__cxx11::string::substr((ulong)local_e8,(ulong)pAVar19);
      std::__cxx11::string::substr((ulong)&local_c8,(ulong)pAVar19);
      uVar15 = local_e8._0_8_;
      puVar9 = (uint *)__errno_location();
      uVar18 = *puVar9;
      prVar14 = (runtime_error *)(ulong)uVar18;
      *puVar9 = 0;
      lVar10 = strtoll((char *)uVar15,(char **)&local_a8,10);
      uVar4 = local_c8._M_allocated_capacity;
      if (local_a8._0_8_ == uVar15) {
        std::__throw_invalid_argument("stoll");
      }
      else {
        uVar1 = *puVar9;
        if (uVar1 == 0) {
          *puVar9 = uVar18;
        }
        else {
          uVar18 = uVar1;
          if (uVar1 == 0x22) {
            std::__throw_out_of_range("stoll");
            goto switchD_001240f9_caseD_4;
          }
        }
        *puVar9 = 0;
        prVar14 = (runtime_error *)&local_a8;
        lVar8 = strtoll((char *)local_c8._M_allocated_capacity,(char **)prVar14,10);
        if (local_a8._0_8_ != uVar4) {
          if (*puVar9 == 0) {
LAB_001245f1:
            *puVar9 = uVar18;
          }
          else if (*puVar9 == 0x22) {
            lVar8 = std::__throw_out_of_range("stoll");
            goto LAB_001245f1;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_allocated_capacity != &local_b8) {
            operator_delete((void *)local_c8._M_allocated_capacity,local_b8._0_8_ + 1);
          }
          dVar21 = (double)lVar8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_e8 + 0x10)) {
            local_80 = (double)lVar8;
            operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
            dVar21 = local_80;
          }
          dVar21 = (double)lVar10 / dVar21;
          goto LAB_001246a1;
        }
      }
      std::__throw_invalid_argument("stoll");
LAB_00124988:
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                     "Undefined name: ",&this->value);
      std::runtime_error::runtime_error(prVar14,(string *)local_e8);
      *(undefined ***)prVar14 = &PTR__runtime_error_0016b300;
      __cxa_throw(prVar14,&eval_error::typeinfo,std::runtime_error::~runtime_error);
    }
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(((string *)pAVar19)->_M_dataplus)._M_p;
    piVar12 = __errno_location();
    iVar7 = *piVar12;
    *piVar12 = 0;
    dVar21 = strtod(paVar20->_M_local_buf,(char **)local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._0_8_ == paVar20) {
      uVar15 = std::__throw_invalid_argument("stod");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_e8 + 0x10)) {
        operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
      }
      if ((char)iVar7 != '\0') {
        __cxa_free_exception(paVar20);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._8_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
      }
      _Unwind_Resume(uVar15);
    }
    if (*piVar12 == 0) {
      *piVar12 = iVar7;
    }
    else if (*piVar12 == 0x22) {
      p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)std::__throw_out_of_range("stod");
      goto LAB_0012451b;
    }
LAB_001246a1:
    local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)operator_new(0x20);
    *(char *)((long)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 8) = '\x01';
    *(char *)((long)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 9) = '\0';
    *(char *)((long)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 10) = '\0';
    *(char *)((long)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 0xb) = '\0';
    *(char *)((long)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 0xc) = '\x01';
    *(char *)((long)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 0xd) = '\0';
    *(char *)((long)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 0xe) = '\0';
    *(char *)((long)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 0xf) = '\0';
    *local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type)&PTR___Sp_counted_ptr_inplace_0016b468;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)((long)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
        0x10))->_M_allocated_capacity = (size_type)&PTR__SchemeObject_0016b698;
    *(double *)
     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)((long)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          + 0x10))->_M_local_buf + 8) = dVar21;
LAB_001246e7:
    __return_storage_ptr__->type = VALUE;
    (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             ((long)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 0x10);
    (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)((long)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr + 8) =
           *(int *)((long)local_a8.value.
                          super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8) +
           1;
      UNLOCK();
    }
    else {
      *(char *)((long)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 8) = '\x02';
      *(char *)((long)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 9) = '\0';
      *(char *)((long)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 10) = '\0';
      *(char *)((long)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 0xb) = '\0';
    }
    (__return_storage_ptr__->tail_context)._M_t.
    super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
    super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
    super__Head_base<0UL,_TailContext_*,_false>._M_head_impl = (TailContext *)0x0;
    goto LAB_00124854;
  case STRING:
switchD_001240f9_caseD_4:
    local_e8._0_8_ = (SchemeString *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<SchemeString,std::allocator<SchemeString>,std::__cxx11::string_const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8),
               (SchemeString **)local_e8,(allocator<SchemeString> *)&local_c8,&pAVar19->value);
    uVar4 = local_e8._8_8_;
    uVar15 = local_e8._0_8_;
    local_e8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_e8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    __return_storage_ptr__->type = VALUE;
    (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)uVar15;
    (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)uVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
LAB_0012465f:
      (__return_storage_ptr__->tail_context)._M_t.
      super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
      super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
      super__Head_base<0UL,_TailContext_*,_false>._M_head_impl = (TailContext *)0x0;
      return __return_storage_ptr__;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(uVar4 + 8) = *(int *)(uVar4 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(uVar4 + 8) = *(int *)(uVar4 + 8) + 1;
    }
    (__return_storage_ptr__->tail_context)._M_t.
    super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
    super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
    super__Head_base<0UL,_TailContext_*,_false>._M_head_impl = (TailContext *)0x0;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
    local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_e8._8_8_;
    break;
  case BOOL:
    iVar7 = std::__cxx11::string::compare((char *)&this->value);
    psVar16 = &scheme_false;
    if (iVar7 == 0) {
      psVar16 = &scheme_true;
    }
    psVar3 = &scheme_false;
    if (iVar7 == 0) {
      psVar3 = &scheme_true;
    }
    __return_storage_ptr__->type = VALUE;
    (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (psVar16->super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var11 = (psVar3->super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var11;
    if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
      }
    }
    goto LAB_0012465f;
  case CHAR:
switchD_001240f9_caseD_6:
    paVar20 = &local_68.field_2;
    pcVar2 = (this->value)._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)paVar20;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar2,pcVar2 + (this->value)._M_string_length);
    uVar6 = char_name_to_char(&local_68);
    p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    p_Var11->_M_use_count = 1;
    p_Var11->_M_weak_count = 1;
    p_Var11->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0016b508;
    p_Var11[1]._vptr__Sp_counted_base = (_func_int **)&PTR__SchemeObject_0016b8e8;
    *(uchar *)&p_Var11[1]._M_use_count = uVar6;
    __return_storage_ptr__->type = VALUE;
    (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)(p_Var11 + 1);
    (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var11;
    if (__libc_single_threaded != '\0') {
      p_Var11->_M_use_count = 2;
      goto LAB_0012451f;
    }
LAB_0012451b:
    LOCK();
    p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
    UNLOCK();
LAB_0012451f:
    (__return_storage_ptr__->tail_context)._M_t.
    super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
    super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
    super__Head_base<0UL,_TailContext_*,_false>._M_head_impl = (TailContext *)0x0;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == paVar20) {
      return __return_storage_ptr__;
    }
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    return __return_storage_ptr__;
  case VECTOR:
    this_02 = (eval_error *)__cxa_allocate_exception(0x10);
    eval_error::runtime_error(this_02,"Trying to evaluate a vector");
    goto LAB_001248fd;
  default:
    p_Var17 = (this->list).
              super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    __x = &this->list;
    if (p_Var17 == (_List_node_base *)__x) goto LAB_001248e1;
    evaluate((ExecutionResult *)local_e8,(ASTNode *)p_Var17[1]._M_next,context);
    ExecutionResult::force_value(&local_a8);
    if ((_Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>)local_e8._24_8_ !=
        (TailContext *)0x0) {
      std::default_delete<TailContext>::operator()
                ((default_delete<TailContext> *)(local_e8 + 0x18),(TailContext *)local_e8._24_8_);
    }
    local_e8._24_8_ = (_Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._16_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
LAB_0012486e:
      local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_a8.tail_context._M_t.
      super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
      super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
      super__Head_base<0UL,_TailContext_*,_false>._M_head_impl =
           (__uniq_ptr_data<TailContext,_std::default_delete<TailContext>,_true,_true>)
           (__uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>)0x0;
LAB_00124876:
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar14,"Trying to call not a function");
      *(undefined ***)prVar14 = &PTR__runtime_error_0016b300;
      __cxa_throw(prVar14,&eval_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_01 = (SchemeSpecialForm *)
              __dynamic_cast(local_a8._0_8_,&SchemeObject::typeinfo,&SchemeSpecialForm::typeinfo,0);
    this_00._M_t.super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
    super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
    super__Head_base<0UL,_TailContext_*,_false>._M_head_impl =
         (__uniq_ptr_data<TailContext,_std::default_delete<TailContext>,_true,_true>)
         (__uniq_ptr_data<TailContext,_std::default_delete<TailContext>,_true,_true>)
         local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_01 == (SchemeSpecialForm *)0x0) {
      local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             __dynamic_cast(local_a8._0_8_,&SchemeObject::typeinfo,&SchemeProcedure::typeinfo,0);
      if (local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0012486e;
      local_a8.tail_context._M_t.
      super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
      super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
      super__Head_base<0UL,_TailContext_*,_false>._M_head_impl =
           (__uniq_ptr_data<TailContext,_std::default_delete<TailContext>,_true,_true>)
           (__uniq_ptr_data<TailContext,_std::default_delete<TailContext>,_true,_true>)
           local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((tuple<TailContext_*,_std::default_delete<TailContext>_>)
          local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (_Head_base<0UL,_TailContext_*,_false>)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&(local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_vptr_SchemeObject)->_M_local_buf + 8) =
               *(int *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)&(local_a8.value.
                              super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                             _vptr_SchemeObject)->_M_local_buf + 8) + 1;
          UNLOCK();
          if (local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
          goto LAB_00124876;
        }
        else {
          *(int *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&(local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_vptr_SchemeObject)->_M_local_buf + 8) =
               *(int *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)&(local_a8.value.
                              super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                             _vptr_SchemeObject)->_M_local_buf + 8) + 1;
        }
      }
      local_c8._M_allocated_capacity = (size_type)&local_c8;
      local_b8._0_8_ = 0;
      p_Var17 = ((__x->
                 super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
                 )._M_impl._M_node.super__List_node_base._M_next)->_M_next;
      local_c8._8_8_ = local_c8._M_allocated_capacity;
      if (p_Var17 != (_List_node_base *)__x) {
        do {
          evaluate((ExecutionResult *)local_e8,(ASTNode *)p_Var17[1]._M_next,context);
          ExecutionResult::force_value((ExecutionResult *)&local_78);
          p_Var13 = (_List_node_base *)operator_new(0x20);
          p_Var13[1]._M_next = local_78;
          p_Var13[1]._M_prev = p_Stack_70;
          std::__detail::_List_node_base::_M_hook(p_Var13);
          local_b8._M_allocated_capacity = local_b8._0_8_ + 1;
          if ((TailContext *)local_e8._24_8_ != (TailContext *)0x0) {
            std::default_delete<TailContext>::operator()
                      ((default_delete<TailContext> *)(local_e8 + 0x18),
                       (TailContext *)local_e8._24_8_);
          }
          local_e8._24_8_ = (_Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>)0x0;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._16_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._16_8_);
          }
          p_Var17 = p_Var17->_M_next;
        } while (p_Var17 != (_List_node_base *)__x);
      }
      ExecutionResult::ExecutionResult
                (__return_storage_ptr__,
                 (shared_ptr<SchemeProcedure> *)
                 &local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 (list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                  *)&local_c8);
      std::__cxx11::
      _List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::
      _M_clear((_List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                *)&local_c8);
      this_00._M_t.super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
      super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
      super__Head_base<0UL,_TailContext_*,_false>._M_head_impl =
           (__uniq_ptr_data<TailContext,_std::default_delete<TailContext>,_true,_true>)
           (__uniq_ptr_data<TailContext,_std::default_delete<TailContext>,_true,_true>)
           local_a8.tail_context;
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&(local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_vptr_SchemeObject)->_M_local_buf + 8) =
               *(int *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)&(local_a8.value.
                              super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                             _vptr_SchemeObject)->_M_local_buf + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&(local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_vptr_SchemeObject)->_M_local_buf + 8) =
               *(int *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)&(local_a8.value.
                              super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                             _vptr_SchemeObject)->_M_local_buf + 8) + 1;
        }
      }
      std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::list
                ((list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *)
                 &local_48,__x);
      SchemeSpecialForm::execute
                (__return_storage_ptr__,this_01,
                 (list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *)
                 &local_48,context);
      std::__cxx11::_List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
      ::_M_clear(&local_48);
    }
    if (this_00._M_t.super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
        super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
        super__Head_base<0UL,_TailContext_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 this_00._M_t.super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>.
                 _M_t.super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
                 super__Head_base<0UL,_TailContext_*,_false>._M_head_impl);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    return __return_storage_ptr__;
  }
LAB_00124854:
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  return __return_storage_ptr__;
}

Assistant:

ExecutionResult ASTNode::evaluate(const Context &context) const
{

    if(type == ast_type_t::INT)
        try
        {
            return ExecutionResult(std::make_shared<SchemeInt>(stoll(value)));
        }
        catch(std::out_of_range &)
        {
            throw eval_error("Invalid integer: " + value);
        }
    if(type == ast_type_t::FLOAT)
    {
        double float_val;
        try
        {
            auto slash_pos = value.find('/');
            if (slash_pos != std::string::npos)
            {
                auto num = value.substr(0, slash_pos);
                auto den = value.substr(slash_pos + 1);
                float_val = double(stoll(num)) / double(stoll(den));
            }
            else
            {
                float_val = stod(value);
            }
        }
        catch(std::out_of_range &)
        {
            throw eval_error("Invalid float: " + value);
        }
        return ExecutionResult(std::make_shared<SchemeFloat>(float_val));
    }
    if(type == ast_type_t::STRING)
        return ExecutionResult(std::make_shared<SchemeString>(value));
    if(type == ast_type_t::CHAR)
        return ExecutionResult(std::make_shared<SchemeChar>(char_name_to_char(value)));
    if(type == ast_type_t::BOOL)
        return ExecutionResult(value == "t" ? scheme_true : scheme_false);
    if(type == ast_type_t::NAME)
    {
        std::shared_ptr<SchemeObject> t{nullptr};
        bool res = context.get(value, t);
        if(t)
            return ExecutionResult(t);
        else if(res)
            throw eval_error("Unassigned variable: " + value);
        else
            throw eval_error("Undefined name: " + value);
    }
    if(type == ast_type_t::VECTOR)
        throw eval_error("Trying to evaluate a vector");
    if(list.empty())
        throw eval_error("Trying to evaluate empty list");

    auto func = list.front()->evaluate(context).force_value();
    auto sf = std::dynamic_pointer_cast<SchemeSpecialForm>(func);
    if(sf)
    {
        return sf->execute(list, context);
    }
    auto f = std::dynamic_pointer_cast<SchemeProcedure>(func);
    if(!f)
    {
        throw eval_error("Trying to call not a function");
    }
    std::list<std::shared_ptr<SchemeObject>> val_list;
    for(auto lit = std::next(list.begin()); lit != list.end(); ++lit)
    {
        val_list.push_back((*lit)->evaluate(context).force_value());
    }
    return ExecutionResult(f, val_list);
}